

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ht_spkitable.c
# Opt level: O2

_Bool spki_records_are_equal(spki_record *r1,spki_record *r2)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  _Bool _Var3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((r1->asn == r2->asn) && (r1->socket == r2->socket)) {
    iVar2 = bcmp(r1,r2,0x14);
    if (iVar2 == 0) {
      iVar2 = bcmp(r1->spki,r2->spki,0x5b);
      _Var3 = iVar2 == 0;
      goto LAB_00103b9a;
    }
  }
  _Var3 = false;
LAB_00103b9a:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return _Var3;
  }
  __stack_chk_fail();
}

Assistant:

static bool spki_records_are_equal(struct spki_record *r1, struct spki_record *r2)
{
	if (r1->asn != r2->asn)
		return false;
	if (r1->socket != r2->socket)
		return false;
	if (memcmp(r1->ski, r2->ski, SKI_SIZE) != 0)
		return false;
	if (memcmp(r1->spki, r2->spki, SPKI_SIZE) != 0)
		return false;

	return true;
}